

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O1

Vec_Int_t * Llb_Nonlin4SweepOrder(Aig_Man_t *pAig,int *pCounter,int fSaveAll)

{
  int iVar1;
  void *pvVar2;
  void **ppvVar3;
  uint in_EAX;
  Vec_Int_t *vOrder;
  int *__s;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int Counter;
  undefined8 uStack_38;
  
  __s = (int *)0x0;
  uStack_38 = (ulong)in_EAX;
  iVar1 = pAig->vObjs->nSize;
  vOrder = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  vOrder->nSize = 0;
  vOrder->nCap = iVar5;
  if (iVar5 != 0) {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  vOrder->pArray = __s;
  vOrder->nSize = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  pVVar4 = pAig->vCos;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar7];
      iVar1 = *(int *)((long)pvVar2 + 0x24);
      iVar5 = uStack_38._4_4_;
      uStack_38 = CONCAT44(uStack_38._4_4_ + 1,(undefined4)uStack_38);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vOrder->pArray[iVar1] = iVar5;
      Llb_Nonlin4SweepOrder_rec
                (pAig,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),vOrder,
                 (int *)((long)&uStack_38 + 4),fSaveAll);
      lVar7 = lVar7 + 1;
      pVVar4 = pAig->vCos;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = pAig->vCis;
  if (0 < pVVar4->nSize) {
    ppvVar3 = pVVar4->pArray;
    lVar7 = 0;
    do {
      iVar1 = *(int *)((long)ppvVar3[lVar7] + 0x24);
      lVar6 = (long)iVar1;
      if ((lVar6 < 0) || (vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vOrder->pArray[lVar6] < 0) {
        iVar1 = uStack_38._4_4_;
        uStack_38 = CONCAT44(uStack_38._4_4_ + 1,(undefined4)uStack_38);
        vOrder->pArray[lVar6] = iVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  if (pCounter != (int *)0x0) {
    *pCounter = uStack_38._4_4_ - (pAig->nObjs[2] + pAig->nObjs[3]);
  }
  return vOrder;
}

Assistant:

Vec_Int_t * Llb_Nonlin4SweepOrder( Aig_Man_t * pAig, int * pCounter, int fSaveAll )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // collect nodes in the order
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Aig_ManForEachCo( pAig, pObj, i )
    {
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
        Llb_Nonlin4SweepOrder_rec( pAig, Aig_ObjFanin0(pObj), vOrder, &Counter, fSaveAll );
    }
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) < 0 )
            Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
//    assert( Counter == Aig_ManObjNum(pAig) - 1 ); // no dangling nodes
    if ( pCounter )
        *pCounter = Counter - Aig_ManCiNum(pAig) - Aig_ManCoNum(pAig);
    return vOrder;
}